

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_outputter.hpp
# Opt level: O2

void hayai::Outputter::WriteTestNameToStream
               (ostream *stream,string *fixtureName,string *testName,
               TestParametersDescriptor *parameters)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  pointer pTVar3;
  long lVar4;
  
  poVar1 = std::operator<<(stream,(string *)fixtureName);
  poVar1 = std::operator<<(poVar1,".");
  std::operator<<(poVar1,(string *)testName);
  if ((parameters->_parameters).
      super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (parameters->_parameters).
      super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::operator<<(stream,"(");
    lVar4 = 0;
    for (uVar2 = 0;
        pTVar3 = (parameters->_parameters).
                 super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar2 < (ulong)((long)(parameters->_parameters).
                              super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 6);
        uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        std::operator<<(stream,", ");
        pTVar3 = (parameters->_parameters).
                 super__Vector_base<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      poVar1 = std::operator<<(stream,(string *)((long)&(pTVar3->Declaration)._M_dataplus + lVar4));
      poVar1 = std::operator<<(poVar1," = ");
      std::operator<<(poVar1,(string *)((long)&(pTVar3->Value)._M_dataplus + lVar4));
      lVar4 = lVar4 + 0x40;
    }
    std::operator<<(stream,")");
    return;
  }
  return;
}

Assistant:

static void WriteTestNameToStream(std::ostream& stream,
                                          const std::string& fixtureName,
                                          const std::string& testName,
                                          const TestParametersDescriptor&
                                              parameters)
        {
            stream << fixtureName << "." << testName;

            const std::vector<TestParameterDescriptor>& descs =
                parameters.Parameters();

            if (descs.empty())
                return;

            stream << "(";

            for (std::size_t i = 0; i < descs.size(); ++i)
            {
                if (i)
                    stream << ", ";

                const TestParameterDescriptor& desc = descs[i];
                stream << desc.Declaration << " = " << desc.Value;
            }

            stream << ")";
        }